

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

bool __thiscall
glcts::PipelineStatisticsQueryTestFunctional7::executeTest
          (PipelineStatisticsQueryTestFunctional7 *this,GLenum current_query_target)

{
  GLuint qo_id;
  GLuint qo_bo_id;
  TestContext *test_context;
  bool bVar1;
  int iVar2;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *context_info;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  GLenum value;
  string local_298;
  MessageBuilder local_268;
  _draw_call_type local_e8;
  uint local_e4;
  uint n_draw_call_type;
  uint count_argument_value;
  _primitive_type current_primitive_type;
  int current_primitive_type_it;
  uint index_data [8];
  float vertex_data [16];
  undefined1 local_70 [4];
  uint n_vertex_components;
  _test_execution_result run_result;
  bool result;
  Functions *gl;
  GLenum current_query_target_local;
  PipelineStatisticsQueryTestFunctional7 *this_local;
  Functions *gl_00;
  
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                      m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
  run_result.result_uint64._7_1_ = 1;
  PipelineStatisticsQueryUtilities::_test_execution_result::_test_execution_result
            ((_test_execution_result *)local_70);
  memcpy(index_data + 6,&DAT_02a65220,0x40);
  _current_primitive_type = 0x200000000;
  index_data[0] = 1;
  index_data[1] = 3;
  index_data[2] = 4;
  index_data[3] = 5;
  index_data[4] = 6;
  index_data[5] = 7;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_baseinstance_argument
       = 1;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_basevertex_argument =
       1;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_count_argument = 3;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_first_argument = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_primcount_argument =
       4;
  PipelineStatisticsQueryTestFunctionalBase::initFBO
            (&this->super_PipelineStatisticsQueryTestFunctionalBase);
  PipelineStatisticsQueryTestFunctionalBase::initVBO
            (&this->super_PipelineStatisticsQueryTestFunctionalBase,(float *)(index_data + 6),0x40,
             &current_primitive_type,0x20,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_count_argument,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_primcount_argument,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_baseinstance_argument,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_first_argument,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_basevertex_argument);
  PipelineStatisticsQueryTestFunctionalBase::initVAO
            (&this->super_PipelineStatisticsQueryTestFunctionalBase,2);
  for (count_argument_value = 0; (int)count_argument_value < 10;
      count_argument_value = count_argument_value + 1) {
    n_draw_call_type = count_argument_value;
    if (count_argument_value != 5) {
      (this->super_PipelineStatisticsQueryTestFunctionalBase).m_current_primitive_type =
           count_argument_value;
      local_e4 = PipelineStatisticsQueryUtilities::getNumberOfVerticesForPrimitiveType
                           ((this->super_PipelineStatisticsQueryTestFunctionalBase).
                            m_current_primitive_type);
      (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_count_argument =
           local_e4;
      (*gl_00->bufferSubData)
                (0x8892,(ulong)(this->super_PipelineStatisticsQueryTestFunctionalBase).
                               m_vbo_indirect_arrays_argument_offset,4,
                 &(this->super_PipelineStatisticsQueryTestFunctionalBase).
                  m_indirect_draw_call_count_argument);
      (*gl_00->bufferSubData)
                (0x8892,(ulong)(this->super_PipelineStatisticsQueryTestFunctionalBase).
                               m_vbo_indirect_elements_argument_offset,4,
                 &(this->super_PipelineStatisticsQueryTestFunctionalBase).
                  m_indirect_draw_call_count_argument);
      GVar3 = (*gl_00->getError)();
      glu::checkError(GVar3,"glBufferSubData() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                      ,0x1031);
      for (local_e8 = DRAW_CALL_TYPE_GLDRAWARRAYS; local_e8 < DRAW_CALL_TYPE_COUNT;
          local_e8 = local_e8 + DRAW_CALL_TYPE_GLDRAWARRAYSINDIRECT) {
        (this->super_PipelineStatisticsQueryTestFunctionalBase).m_current_draw_call_type = local_e8;
        bVar1 = PipelineStatisticsQueryUtilities::isDrawCallSupported
                          ((this->super_PipelineStatisticsQueryTestFunctionalBase).
                           m_current_draw_call_type,gl_00);
        if (bVar1) {
          (*gl_00->clear)(0x4100);
          GVar3 = (*gl_00->getError)();
          glu::checkError(GVar3,"glClear() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                          ,0x1041);
          qo_id = (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id;
          qo_bo_id = (this->super_PipelineStatisticsQueryTestFunctionalBase).m_bo_qo_id;
          pRVar4 = deqp::Context::getRenderContext
                             ((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase
                              .m_context);
          test_context = (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                         super_TestCase.super_TestNode.m_testCtx;
          context_info = deqp::Context::getContextInfo
                                   ((this->super_PipelineStatisticsQueryTestFunctionalBase).
                                    super_TestCase.m_context);
          bVar1 = PipelineStatisticsQueryUtilities::executeQuery
                            (current_query_target,qo_id,qo_bo_id,
                             PipelineStatisticsQueryTestFunctionalBase::queryCallbackDrawCallHandler
                             ,this,pRVar4,test_context,context_info,
                             (_test_execution_result *)local_70);
          if (bVar1) {
            bVar1 = PipelineStatisticsQueryUtilities::verifyResultValues
                              ((_test_execution_result *)local_70,1,&executeTest::expected_value,
                               (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id != 0,
                               current_query_target,
                               &(this->super_PipelineStatisticsQueryTestFunctionalBase).
                                m_current_draw_call_type,
                               &(this->super_PipelineStatisticsQueryTestFunctionalBase).
                                m_current_primitive_type,false,
                               (this->super_PipelineStatisticsQueryTestFunctionalBase).
                               super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                               VERIFICATION_TYPE_EQUAL_OR_GREATER);
            run_result.result_uint64._7_1_ = (run_result.result_uint64._7_1_ & 1 & bVar1) != 0;
          }
          else {
            this_00 = tcu::TestContext::getLog
                                ((this->super_PipelineStatisticsQueryTestFunctionalBase).
                                 super_TestCase.super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_268,this_00,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar5 = tcu::MessageBuilder::operator<<
                               (&local_268,
                                (char (*) [55])
                                "Could not retrieve test run results for query target [");
            PipelineStatisticsQueryUtilities::getStringForEnum_abi_cxx11_
                      (&local_298,(PipelineStatisticsQueryUtilities *)(ulong)current_query_target,
                       value);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_298);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x29ea7ce);
            tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_298);
            tcu::MessageBuilder::~MessageBuilder(&local_268);
            run_result.result_uint64._7_1_ = 0;
          }
        }
      }
    }
  }
  return (bool)(run_result.result_uint64._7_1_ & 1);
}

Assistant:

bool PipelineStatisticsQueryTestFunctional7::executeTest(glw::GLenum current_query_target)
{
	const glw::Functions&									 gl		= m_context.getRenderContext().getFunctions();
	bool													 result = true;
	PipelineStatisticsQueryUtilities::_test_execution_result run_result;

	/* Sanity check: This method should only be called for GL_FRAGMENT_SHADER_INVOCATIONS_ARB query */
	DE_ASSERT(current_query_target == GL_FRAGMENT_SHADER_INVOCATIONS_ARB);

	/* Set up VBO. */
	const unsigned int n_vertex_components = 2;
	const float		   vertex_data[]	   = { 0.0f,  0.75f, -0.75f, -0.75f, 0.75f, -0.75f, 0.3f, 0.7f,
								  -0.4f, 0.2f,  0.6f,   -0.3f,  -0.3f, -0.7f,  0.0f, 0.0f };
	const unsigned int index_data[] = { 0, 2, 1, 3, 4, 5, 6, 7 };

	m_indirect_draw_call_baseinstance_argument = 1;
	m_indirect_draw_call_basevertex_argument   = 1;
	m_indirect_draw_call_count_argument =
		3; /* this value will be updated in the actual loop, so use anything for now */
	m_indirect_draw_call_first_argument		= 0;
	m_indirect_draw_call_primcount_argument = 4;

	initFBO();
	initVBO(vertex_data, sizeof(vertex_data), index_data, sizeof(index_data), m_indirect_draw_call_count_argument,
			m_indirect_draw_call_primcount_argument, m_indirect_draw_call_baseinstance_argument,
			m_indirect_draw_call_first_argument, m_indirect_draw_call_basevertex_argument);

	initVAO(n_vertex_components);

	/* Iterate over all primitive types */
	for (int current_primitive_type_it = static_cast<int>(PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_FIRST);
		 current_primitive_type_it < static_cast<int>(PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_COUNT);
		 ++current_primitive_type_it)
	{
		PipelineStatisticsQueryUtilities::_primitive_type current_primitive_type =
			static_cast<PipelineStatisticsQueryUtilities::_primitive_type>(current_primitive_type_it);
		/* Exclude 'patches' primitive type */
		if (current_primitive_type == PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_PATCHES)
		{
			continue;
		}

		m_current_primitive_type = current_primitive_type;

		/* Update 'count' argument so that we only use as many vertices as needed for current
		 * primitive type.
		 */
		unsigned int count_argument_value =
			PipelineStatisticsQueryUtilities::getNumberOfVerticesForPrimitiveType(m_current_primitive_type);

		m_indirect_draw_call_count_argument = count_argument_value;

		gl.bufferSubData(GL_ARRAY_BUFFER, m_vbo_indirect_arrays_argument_offset, sizeof(unsigned int),
						 &m_indirect_draw_call_count_argument);
		gl.bufferSubData(GL_ARRAY_BUFFER, m_vbo_indirect_elements_argument_offset, sizeof(unsigned int),
						 &m_indirect_draw_call_count_argument);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call(s) failed.");

		/* Iterate through all draw call types */
		for (unsigned int n_draw_call_type = 0;
			 n_draw_call_type < PipelineStatisticsQueryUtilities::DRAW_CALL_TYPE_COUNT; ++n_draw_call_type)
		{
			m_current_draw_call_type = (PipelineStatisticsQueryUtilities::_draw_call_type)n_draw_call_type;

			/* Only continue if the draw call is supported by the context */
			if (!PipelineStatisticsQueryUtilities::isDrawCallSupported(m_current_draw_call_type, gl))
			{
				continue;
			}

			/* Clear the buffers before we proceed */
			gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() call failed.");

			/* Execute the query */
			if (!PipelineStatisticsQueryUtilities::executeQuery(
					current_query_target, m_qo_id, m_bo_qo_id, queryCallbackDrawCallHandler,
					(PipelineStatisticsQueryTestFunctionalBase*)this, m_context.getRenderContext(), m_testCtx,
					m_context.getContextInfo(), &run_result))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Could not retrieve test run results for query target "
															   "["
								   << PipelineStatisticsQueryUtilities::getStringForEnum(current_query_target) << "]"
								   << tcu::TestLog::EndMessage;

				result = false;
			}
			else
			{
				static const glw::GLuint64 expected_value = 1; /* as per test spec */

				/* Compare it against query result values */
				result &= PipelineStatisticsQueryUtilities::verifyResultValues(
					run_result, 1, &expected_value, m_qo_id != 0, /* should_check_qo_bo_values */
					current_query_target, &m_current_draw_call_type, &m_current_primitive_type,
					false, /* is_primitive_restart_enabled */
					m_testCtx, PipelineStatisticsQueryUtilities::VERIFICATION_TYPE_EQUAL_OR_GREATER);

			} /* if (run results were obtained successfully) */
		}	 /* for (all draw call types) */
	}		  /* for (all primitive types) */

	return result;
}